

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFDocument.cpp
# Opt level: O0

shared_ptr<iDynTree::XMLElement> __thiscall
iDynTree::URDFDocument::rootElementForName
          (URDFDocument *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *packageDirs)

{
  bool bVar1;
  XMLElement *this_00;
  XMLParserState *pXVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<iDynTree::XMLElement> *this_01;
  shared_ptr<iDynTree::RobotElement> *__r;
  shared_ptr<iDynTree::XMLElement> sVar4;
  XMLElement *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>_>_>
  *in_stack_fffffffffffffe98;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>_>_>
  *in_stack_fffffffffffffea0;
  vector<std::shared_ptr<iDynTree::SensorHelper>,_std::allocator<std::shared_ptr<iDynTree::SensorHelper>_>_>
  *in_stack_fffffffffffffea8;
  Model *in_stack_fffffffffffffeb0;
  XMLParserState *in_stack_fffffffffffffeb8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo>_>_>
  *in_stack_fffffffffffffee0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>_>_>_>
  *in_stack_fffffffffffffee8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>_>_>_>
  *in_stack_fffffffffffffef0;
  
  bVar1 = std::operator==(in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
  if (bVar1) {
    iDynTree::Model::Model((Model *)&stack0xfffffffffffffeb0);
    iDynTree::Model::operator=((Model *)(in_RSI + 0x10),(Model *)&stack0xfffffffffffffeb0);
    iDynTree::Model::~Model((Model *)&stack0xfffffffffffffeb0);
    iDynTree::Model::setPackageDirs((vector *)(in_RSI + 0x10));
    std::
    vector<std::shared_ptr<iDynTree::SensorHelper>,_std::allocator<std::shared_ptr<iDynTree::SensorHelper>_>_>
    ::clear((vector<std::shared_ptr<iDynTree::SensorHelper>,_std::allocator<std::shared_ptr<iDynTree::SensorHelper>_>_>
             *)0x192d33);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>_>_>
    ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>_>_>
             *)0x192d48);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>_>_>
    ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>_>_>
             *)0x192d5d);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo>_>_>
    ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo>_>_>
             *)0x192d75);
    iDynTree::XMLDocument::getParserState();
    __r = (shared_ptr<iDynTree::RobotElement> *)(in_RSI + 0x1f0);
    this_01 = (shared_ptr<iDynTree::XMLElement> *)(in_RSI + 0x228);
    std::
    make_shared<iDynTree::RobotElement,iDynTree::XMLParserState&,iDynTree::Model&,std::vector<std::shared_ptr<iDynTree::SensorHelper>,std::allocator<std::shared_ptr<iDynTree::SensorHelper>>>&,std::unordered_map<std::__cxx11::string,iDynTree::JointElement::JointInfo,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>>>&,std::unordered_map<std::__cxx11::string,iDynTree::JointElement::JointInfo,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>>>&,std::unordered_map<std::__cxx11::string,iDynTree::MaterialElement::MaterialInfo,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,iDynTree::MaterialElement::MaterialInfo>>>&,std::unordered_map<std::__cxx11::string,std::vector<iDynTree::VisualElement::VisualInfo,std::allocator<iDynTree::VisualElement::VisualInfo>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<iDynTree::VisualElement::VisualInfo,std::allocator<iDynTree::VisualElement::VisualInfo>>>>>&,std::unordered_map<std::__cxx11::string,std::vector<iDynTree::VisualElement::VisualInfo,std::allocator<iDynTree::VisualElement::VisualInfo>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<iDynTree::VisualElement::VisualInfo,std::allocator<iDynTree::VisualElement::VisualInfo>>>>>&>
              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffee8,in_stack_fffffffffffffef0);
    std::shared_ptr<iDynTree::XMLElement>::shared_ptr<iDynTree::RobotElement,void>(this_01,__r);
    std::shared_ptr<iDynTree::RobotElement>::~shared_ptr
              ((shared_ptr<iDynTree::RobotElement> *)0x192e13);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    this_00 = (XMLElement *)operator_new(0x10);
    pXVar2 = (XMLParserState *)iDynTree::XMLDocument::getParserState();
    iDynTree::XMLElement::XMLElement(this_00,pXVar2);
    std::shared_ptr<iDynTree::XMLElement>::shared_ptr<iDynTree::XMLElement,void>
              ((shared_ptr<iDynTree::XMLElement> *)in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe48);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<iDynTree::XMLElement>)
         sVar4.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<XMLElement> URDFDocument::rootElementForName(const std::string& name,
                                                                 const std::vector<std::string>& packageDirs)
    {
        // allowed tag is <robot>
        if (name == "robot") {
            m_model = iDynTree::Model();
            m_model.setPackageDirs(packageDirs);
            m_buffers.sensorHelpers.clear();
            m_buffers.joints.clear();
            m_buffers.fixedJoints.clear();
            m_buffers.materials.clear();

            return std::make_shared<RobotElement>(getParserState(), 
                                                  m_model,
                                                  m_buffers.sensorHelpers,
                                                  m_buffers.joints,
                                                  m_buffers.fixedJoints,
                                                  m_buffers.materials,
                                                  m_buffers.visuals,
                                                  m_buffers.collisions);
        }
        // TODO: raise an error here
        return std::shared_ptr<XMLElement>(new XMLElement(getParserState()));
    }